

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeBeginStmt(Btree *p,int iStatement)

{
  int iVar1;
  int in_ESI;
  Pager *in_RDI;
  BtShared *pBt;
  int rc;
  
  sqlite3BtreeEnter((Btree *)0x1499a4);
  iVar1 = sqlite3PagerOpenSavepoint(in_RDI,in_ESI);
  sqlite3BtreeLeave((Btree *)0x1499c2);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginStmt(Btree *p, int iStatement){
  int rc;
  BtShared *pBt = p->pBt;
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( iStatement>0 );
  assert( iStatement>p->db->nSavepoint );
  assert( pBt->inTransaction==TRANS_WRITE );
  /* At the pager level, a statement transaction is a savepoint with
  ** an index greater than all savepoints created explicitly using
  ** SQL statements. It is illegal to open, release or rollback any
  ** such savepoints while the statement transaction savepoint is active.
  */
  rc = sqlite3PagerOpenSavepoint(pBt->pPager, iStatement);
  sqlite3BtreeLeave(p);
  return rc;
}